

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

AstNode * new_field_selector(ParserState *parser,StringObject *ts)

{
  AstNode *pAVar1;
  AstNode *pAVar2;
  
  pAVar1 = allocate_expr_ast_node(parser,EXPR_FIELD_SELECTOR);
  pAVar2 = allocate_expr_ast_node(parser,EXPR_LITERAL);
  (pAVar2->field_2).common_expr.type.type_code = RAVI_TSTRING;
  (pAVar2->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar2->field_2).function_call_expr.method_name = ts;
  (pAVar1->field_2).function_stmt.function_expr = pAVar2;
  (pAVar1->field_2).common_expr.type.type_code = RAVI_TANY;
  (pAVar1->field_2).goto_stmt.name = (StringObject *)0x0;
  return pAVar1;
}

Assistant:

static AstNode *new_field_selector(ParserState *parser, const StringObject *ts)
{
	AstNode *index = allocate_expr_ast_node(parser, EXPR_FIELD_SELECTOR);
	index->index_expr.expr = new_string_literal(parser, ts);
	set_type(&index->index_expr.type, RAVI_TANY);
	return index;
}